

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O2

HTS_Boolean
HTS_PStreamSet_create
          (HTS_PStreamSet *pss,HTS_SStreamSet *sss,double *msd_threshold,double *gv_weight)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  double **ppdVar6;
  double *pdVar7;
  int iVar8;
  HTS_Boolean HVar9;
  int iVar10;
  size_t sVar11;
  HTS_PStream *pHVar12;
  double **ppdVar13;
  double *pdVar14;
  HTS_Boolean *pHVar15;
  int *piVar16;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined8 *puVar21;
  int iVar22;
  ulong stream_index;
  long lVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined8 uVar37;
  double dVar38;
  undefined8 uVar39;
  double dVar40;
  double dVar41;
  double vari;
  double mean;
  double local_a8;
  double dStack_a0;
  double *local_98;
  double *local_90;
  double local_88;
  undefined8 uStack_80;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if (pss->nstream == 0) {
    local_98 = msd_threshold;
    local_90 = gv_weight;
    sVar11 = HTS_SStreamSet_get_nstream(sss);
    pss->nstream = sVar11;
    pHVar12 = (HTS_PStream *)HTS_calloc(sVar11,0x90);
    pss->pstream = pHVar12;
    sVar11 = HTS_SStreamSet_get_total_frame(sss);
    pss->total_frame = sVar11;
    for (stream_index = 0; stream_index < pss->nstream; stream_index = stream_index + 1) {
      pHVar12 = pss->pstream + stream_index;
      HVar9 = HTS_SStreamSet_is_msd(sss,stream_index);
      if (HVar9 == '\x01') {
        pHVar12->length = 0;
        for (uVar26 = 0; sVar11 = HTS_SStreamSet_get_total_state(sss), uVar26 < sVar11;
            uVar26 = uVar26 + 1) {
          dVar31 = HTS_SStreamSet_get_msd(sss,stream_index,uVar26);
          if (local_98[stream_index] <= dVar31 && dVar31 != local_98[stream_index]) {
            sVar11 = HTS_SStreamSet_get_duration(sss,uVar26);
            pHVar12->length = pHVar12->length + sVar11;
          }
        }
        pHVar15 = (HTS_Boolean *)HTS_calloc(pss->total_frame,1);
        pHVar12->msd_flag = pHVar15;
        lVar27 = 0;
        for (uVar26 = 0; sVar11 = HTS_SStreamSet_get_total_state(sss), uVar26 < sVar11;
            uVar26 = uVar26 + 1) {
          dVar31 = HTS_SStreamSet_get_msd(sss,stream_index,uVar26);
          if (dVar31 < local_98[stream_index] || dVar31 == local_98[stream_index]) {
            for (uVar19 = 0; sVar11 = HTS_SStreamSet_get_duration(sss,uVar26), uVar19 < sVar11;
                uVar19 = uVar19 + 1) {
              pHVar12->msd_flag[uVar19 + lVar27] = '\0';
            }
          }
          else {
            for (uVar19 = 0; sVar11 = HTS_SStreamSet_get_duration(sss,uVar26), uVar19 < sVar11;
                uVar19 = uVar19 + 1) {
              pHVar12->msd_flag[uVar19 + lVar27] = '\x01';
            }
          }
          lVar27 = lVar27 + uVar19;
        }
      }
      else {
        pHVar12->length = pss->total_frame;
        pHVar12->msd_flag = (HTS_Boolean *)0x0;
      }
      sVar11 = HTS_SStreamSet_get_vector_length(sss,stream_index);
      pHVar12->vector_length = sVar11;
      sVar11 = HTS_SStreamSet_get_window_max_width(sss,stream_index);
      pHVar12->width = sVar11 * 2 + 1;
      sVar11 = HTS_SStreamSet_get_window_size(sss,stream_index);
      pHVar12->win_size = sVar11;
      if (pHVar12->length != 0) {
        ppdVar13 = HTS_alloc_matrix(pHVar12->length,pHVar12->vector_length * sVar11);
        (pHVar12->sm).mean = ppdVar13;
        ppdVar13 = HTS_alloc_matrix(pHVar12->length,pHVar12->win_size * pHVar12->vector_length);
        (pHVar12->sm).ivar = ppdVar13;
        pdVar14 = (double *)HTS_calloc(pHVar12->length,8);
        (pHVar12->sm).wum = pdVar14;
        ppdVar13 = HTS_alloc_matrix(pHVar12->length,pHVar12->width);
        (pHVar12->sm).wuw = ppdVar13;
        pdVar14 = (double *)HTS_calloc(pHVar12->length,8);
        (pHVar12->sm).g = pdVar14;
        ppdVar13 = HTS_alloc_matrix(pHVar12->length,pHVar12->vector_length);
        pHVar12->par = ppdVar13;
        sVar11 = pHVar12->win_size;
      }
      piVar16 = (int *)HTS_calloc(sVar11,4);
      pHVar12->win_l_width = piVar16;
      piVar16 = (int *)HTS_calloc(pHVar12->win_size,4);
      pHVar12->win_r_width = piVar16;
      ppdVar13 = (double **)HTS_calloc(pHVar12->win_size,8);
      pHVar12->win_coefficient = ppdVar13;
      for (uVar26 = 0; uVar26 < pHVar12->win_size; uVar26 = uVar26 + 1) {
        iVar10 = HTS_SStreamSet_get_window_left_width(sss,stream_index,uVar26);
        pHVar12->win_l_width[uVar26] = iVar10;
        iVar10 = HTS_SStreamSet_get_window_right_width(sss,stream_index,uVar26);
        pHVar12->win_r_width[uVar26] = iVar10;
        pdVar14 = (double *)
                  HTS_calloc((long)(int)((uint)(iVar10 + pHVar12->win_l_width[uVar26] == 0) +
                                        pHVar12->win_l_width[uVar26] * -2),8);
        pHVar12->win_coefficient[uVar26] = pdVar14;
        pHVar12->win_coefficient[uVar26] =
             pHVar12->win_coefficient[uVar26] + -(long)pHVar12->win_l_width[uVar26];
        for (lVar27 = (long)pHVar12->win_l_width[uVar26]; lVar27 <= pHVar12->win_r_width[uVar26];
            lVar27 = lVar27 + 1) {
          dVar31 = HTS_SStreamSet_get_window_coefficient(sss,stream_index,uVar26,(int)lVar27);
          pHVar12->win_coefficient[uVar26][lVar27] = dVar31;
        }
      }
      HVar9 = HTS_SStreamSet_use_gv(sss,stream_index);
      if (HVar9 == '\0') {
        pHVar12->gv_switch = (HTS_Boolean *)0x0;
        pHVar12->gv_length = 0;
        pHVar12->gv_mean = (double *)0x0;
        pHVar12->gv_vari = (double *)0x0;
      }
      else {
        pdVar14 = (double *)HTS_calloc(pHVar12->vector_length,8);
        pHVar12->gv_mean = pdVar14;
        pdVar14 = (double *)HTS_calloc(pHVar12->vector_length,8);
        pHVar12->gv_vari = pdVar14;
        for (uVar26 = 0; uVar26 < pHVar12->vector_length; uVar26 = uVar26 + 1) {
          dVar31 = HTS_SStreamSet_get_gv_mean(sss,stream_index,uVar26);
          pHVar12->gv_mean[uVar26] = dVar31 * local_90[stream_index];
          dVar31 = HTS_SStreamSet_get_gv_vari(sss,stream_index,uVar26);
          pHVar12->gv_vari[uVar26] = dVar31;
        }
        pHVar15 = (HTS_Boolean *)HTS_calloc(pHVar12->length,1);
        pHVar12->gv_switch = pHVar15;
        HVar9 = HTS_SStreamSet_is_msd(sss,stream_index);
        if (HVar9 == '\x01') {
          lVar28 = 0;
          lVar27 = 0;
          for (uVar26 = 0; sVar11 = HTS_SStreamSet_get_total_state(sss), uVar26 < sVar11;
              uVar26 = uVar26 + 1) {
            for (uVar19 = 0; sVar11 = HTS_SStreamSet_get_duration(sss,uVar26), uVar19 < sVar11;
                uVar19 = uVar19 + 1) {
              if (pHVar12->msd_flag[uVar19 + lVar28] == '\x01') {
                HVar9 = HTS_SStreamSet_get_gv_switch(sss,stream_index,uVar26);
                pHVar12->gv_switch[lVar27] = HVar9;
                lVar27 = lVar27 + 1;
              }
            }
            lVar28 = lVar28 + uVar19;
          }
        }
        else {
          lVar27 = 0;
          for (uVar26 = 0; sVar11 = HTS_SStreamSet_get_total_state(sss), uVar26 < sVar11;
              uVar26 = uVar26 + 1) {
            for (uVar19 = 0; sVar11 = HTS_SStreamSet_get_duration(sss,uVar26), uVar19 < sVar11;
                uVar19 = uVar19 + 1) {
              HVar9 = HTS_SStreamSet_get_gv_switch(sss,stream_index,uVar26);
              pHVar12->gv_switch[uVar19 + lVar27] = HVar9;
            }
            lVar27 = lVar27 + uVar19;
          }
        }
        pHVar12->gv_length = 0;
        sVar11 = 0;
        for (sVar17 = 0; pHVar12->length != sVar17; sVar17 = sVar17 + 1) {
          if (pHVar12->gv_switch[sVar17] != '\0') {
            sVar11 = sVar11 + 1;
            pHVar12->gv_length = sVar11;
          }
        }
      }
      HVar9 = HTS_SStreamSet_is_msd(sss,stream_index);
      if (HVar9 == '\x01') {
        dVar31 = 0.0;
        lVar27 = 0;
        for (uVar26 = 0; sVar11 = HTS_SStreamSet_get_total_state(sss), uVar26 < sVar11;
            uVar26 = uVar26 + 1) {
          for (uVar19 = 0; sVar11 = HTS_SStreamSet_get_duration(sss,uVar26), uVar19 < sVar11;
              uVar19 = uVar19 + 1) {
            if (pHVar12->msd_flag[(long)dVar31] == '\x01') {
              local_a8 = dVar31;
              for (uVar29 = 0; uVar29 < pHVar12->win_size; uVar29 = uVar29 + 1) {
                iVar10 = pHVar12->win_r_width[uVar29];
                lVar28 = (long)pHVar12->win_l_width[uVar29];
                do {
                  lVar23 = lVar28;
                  if (((iVar10 < lVar23) || (pHVar12->win_l_width[uVar29] + SUB84(local_a8,0) < 0))
                     || ((long)(int)pss->total_frame <= SUB84(dVar31,0) + lVar23)) break;
                  lVar28 = lVar23 + 1;
                } while (pHVar12->msd_flag[lVar23 + (long)local_a8] == '\x01');
                for (uVar20 = 0; uVar20 < pHVar12->vector_length; uVar20 = uVar20 + 1) {
                  sVar11 = pHVar12->vector_length * uVar29 + uVar20;
                  dVar32 = HTS_SStreamSet_get_mean(sss,stream_index,uVar26,sVar11);
                  (pHVar12->sm).mean[lVar27][sVar11] = dVar32;
                  dVar32 = 0.0;
                  if (uVar29 == 0 || iVar10 < lVar23) {
                    dVar32 = HTS_SStreamSet_get_vari(sss,stream_index,uVar26,sVar11);
                    dVar32 = HTS_finv(dVar32);
                  }
                  (pHVar12->sm).ivar[lVar27][sVar11] = dVar32;
                }
              }
              lVar27 = lVar27 + 1;
              dVar31 = local_a8;
            }
            dVar31 = (double)((long)dVar31 + 1);
          }
        }
      }
      else {
        lVar27 = 0;
        for (uVar26 = 0; sVar11 = HTS_SStreamSet_get_total_state(sss), uVar26 < sVar11;
            uVar26 = uVar26 + 1) {
          uVar18 = (int)lVar27 - 1;
          uVar19 = 0;
          while( true ) {
            sVar11 = HTS_SStreamSet_get_duration(sss,uVar26);
            if (sVar11 <= uVar19) break;
            local_a8 = (double)(ulong)uVar18;
            for (uVar29 = 0; uVar29 < pHVar12->win_size; uVar29 = uVar29 + 1) {
              iVar10 = pHVar12->win_r_width[uVar29];
              iVar8 = pHVar12->win_l_width[uVar29];
              do {
                iVar22 = iVar8;
                if ((iVar10 < iVar22) || (pHVar12->win_l_width[uVar29] + (int)lVar27 < 0)) break;
                iVar8 = iVar22 + 1;
              } while (SUB84(local_a8,0) + iVar22 + 1 < (int)pss->total_frame);
              for (uVar20 = 0; uVar20 < pHVar12->vector_length; uVar20 = uVar20 + 1) {
                sVar11 = pHVar12->vector_length * uVar29 + uVar20;
                dVar31 = HTS_SStreamSet_get_mean(sss,stream_index,uVar26,sVar11);
                (pHVar12->sm).mean[lVar27][sVar11] = dVar31;
                dVar31 = 0.0;
                if (uVar29 == 0 || iVar10 < iVar22) {
                  dVar31 = HTS_SStreamSet_get_vari(sss,stream_index,uVar26,sVar11);
                  dVar31 = HTS_finv(dVar31);
                }
                (pHVar12->sm).ivar[lVar27][sVar11] = dVar31;
              }
            }
            lVar27 = lVar27 + 1;
            uVar19 = uVar19 + 1;
            uVar18 = SUB84(local_a8,0) + 1;
          }
        }
      }
      if (pHVar12->length != 0) {
        for (uVar26 = 0; uVar26 < pHVar12->vector_length; uVar26 = uVar26 + 1) {
          HTS_PStream_calc_wuw_and_wum(pHVar12,uVar26);
          uVar19 = pHVar12->length;
          lVar27 = -8;
          lVar28 = -1;
          uVar29 = 1;
          for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
            uVar3 = pHVar12->width;
            lVar23 = lVar28;
            for (uVar24 = uVar29; (uVar24 <= uVar20 && (uVar24 < uVar3)); uVar24 = uVar24 + 1) {
              ppdVar13 = (pHVar12->sm).wuw;
              pdVar14 = ppdVar13[lVar23];
              dVar31 = pdVar14[uVar24];
              pdVar4 = ppdVar13[uVar20];
              *pdVar4 = *pdVar4 - dVar31 * dVar31 * *pdVar14;
              lVar23 = lVar23 + -1;
            }
            lVar23 = 2;
            lVar25 = 0x10;
            for (uVar24 = uVar29; uVar24 < uVar3; uVar24 = uVar24 + 1) {
              ppdVar13 = (pHVar12->sm).wuw;
              puVar21 = (undefined8 *)((long)ppdVar13 + lVar27);
              for (uVar30 = uVar29; (uVar30 <= uVar20 && ((lVar23 + uVar30) - 1 < uVar3));
                  uVar30 = uVar30 + 1) {
                pdVar14 = (double *)*puVar21;
                ppdVar13[uVar20][uVar24] =
                     ppdVar13[uVar20][uVar24] -
                     *(double *)((long)pdVar14 + lVar25 + -8 + uVar30 * 8) * pdVar14[uVar30] *
                     *pdVar14;
                puVar21 = puVar21 + -1;
              }
              pdVar14 = ppdVar13[uVar20];
              pdVar14[uVar24] = pdVar14[uVar24] / *pdVar14;
              lVar25 = lVar25 + 8;
              lVar23 = lVar23 + 1;
            }
            lVar28 = lVar28 + 1;
            lVar27 = lVar27 + 8;
          }
          lVar27 = -8;
          for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
            pdVar14 = (pHVar12->sm).g;
            dVar31 = (pHVar12->sm).wum[uVar20];
            pdVar14[uVar20] = dVar31;
            uVar3 = pHVar12->width;
            lVar28 = lVar27;
            for (uVar24 = uVar29; (uVar24 <= uVar20 && (uVar24 < uVar3)); uVar24 = uVar24 + 1) {
              dVar31 = dVar31 - *(double *)
                                 (*(long *)((long)(pHVar12->sm).wuw + lVar28) + uVar24 * 8) *
                                *(double *)((long)pdVar14 + lVar28);
              pdVar14[uVar20] = dVar31;
              lVar28 = lVar28 + -8;
            }
            lVar27 = lVar27 + 8;
          }
          lVar27 = uVar19 * 8;
          uVar29 = uVar19;
          for (uVar20 = 0; uVar20 != uVar19; uVar20 = uVar20 + 1) {
            lVar28 = ~uVar20 + uVar19;
            ppdVar13 = pHVar12->par;
            pdVar14 = (pHVar12->sm).wuw[lVar28];
            dVar31 = (pHVar12->sm).g[lVar28] / *pdVar14;
            pdVar4 = ppdVar13[lVar28];
            pdVar4[uVar26] = dVar31;
            uVar3 = pHVar12->width;
            uVar24 = 0;
            while ((uVar24 + 1 < uVar3 && (uVar29 + uVar24 < uVar19))) {
              dVar31 = dVar31 - pdVar14[uVar24 + 1] *
                                *(double *)
                                 (*(long *)((long)ppdVar13 + uVar24 * 8 + lVar27) + uVar26 * 8);
              pdVar4[uVar26] = dVar31;
              uVar24 = uVar24 + 1;
            }
            lVar27 = lVar27 + -8;
            uVar29 = uVar29 - 1;
          }
          if (pHVar12->gv_length != 0) {
            HTS_PStream_calc_gv(pHVar12,uVar26,&mean,&vari);
            dVar31 = pHVar12->gv_mean[uVar26] / vari;
            if (dVar31 < 0.0) {
              dVar31 = sqrt(dVar31);
            }
            else {
              dVar31 = SQRT(dVar31);
            }
            sVar11 = pHVar12->length;
            for (sVar17 = 0; sVar11 != sVar17; sVar17 = sVar17 + 1) {
              if (pHVar12->gv_switch[sVar17] != '\0') {
                pHVar12->par[sVar17][uVar26] = (pHVar12->par[sVar17][uVar26] - mean) * dVar31 + mean
                ;
              }
            }
            HTS_PStream_calc_wuw_and_wum(pHVar12,uVar26);
            uVar19 = pHVar12->length;
            lVar27 = pHVar12->win_size * uVar19;
            auVar33._8_4_ = (int)((ulong)lVar27 >> 0x20);
            auVar33._0_8_ = lVar27;
            auVar33._12_4_ = 0x45300000;
            auVar34._8_4_ = (int)(uVar19 >> 0x20);
            auVar34._0_8_ = uVar19;
            auVar34._12_4_ = 0x45300000;
            dStack_50 = auVar34._8_8_ - 1.9342813113834067e+25;
            local_58 = dStack_50 + ((double)CONCAT44(0x43300000,(int)uVar19) - 4503599627370496.0);
            local_68 = 1.0 / ((auVar33._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)lVar27) - 4503599627370496.0));
            local_78 = -local_68;
            lVar28 = uVar19 * uVar19;
            auVar35._8_4_ = (int)((ulong)lVar28 >> 0x20);
            auVar35._0_8_ = lVar28;
            auVar35._12_4_ = 0x45300000;
            lVar27 = uVar19 - 1;
            auVar36._8_4_ = (int)((ulong)lVar27 >> 0x20);
            auVar36._0_8_ = lVar27;
            auVar36._12_4_ = 0x45300000;
            dStack_a0 = auVar36._8_8_ - 1.9342813113834067e+25;
            local_a8 = dStack_a0 + ((double)CONCAT44(0x43300000,(int)lVar27) - 4503599627370496.0);
            dVar32 = 0.0;
            uVar39 = 0;
            dVar31 = 0.1;
            uStack_60 = 0;
            uStack_70 = 0x8000000000000000;
            uVar37 = 0;
            for (uVar29 = 1; uVar29 != 6; uVar29 = uVar29 + 1) {
              local_88 = dVar31;
              uStack_80 = uVar37;
              local_48 = dVar32;
              uStack_40 = uVar39;
              HTS_PStream_calc_gv(pHVar12,uVar26,&mean,&vari);
              pdVar14 = pHVar12->gv_mean;
              pdVar4 = pHVar12->gv_vari;
              dVar31 = pdVar4[uVar26];
              dVar32 = pdVar14[uVar26];
              lVar27 = 0;
              uVar20 = 0;
              while (uVar20 != uVar19) {
                ppdVar13 = (pHVar12->sm).wuw;
                pdVar5 = ppdVar13[uVar20];
                ppdVar6 = pHVar12->par;
                dVar38 = *pdVar5 * ppdVar6[uVar20][uVar26];
                pdVar7 = (pHVar12->sm).g;
                pdVar7[uVar20] = dVar38;
                uVar3 = pHVar12->width;
                lVar23 = -1;
                for (uVar24 = 1; uVar24 < uVar3; uVar24 = uVar24 + 1) {
                  if (uVar20 + uVar24 < uVar19) {
                    dVar38 = dVar38 + pdVar5[uVar24] *
                                      *(double *)
                                       (*(long *)((long)ppdVar6 + uVar24 * 8 + lVar27) + uVar26 * 8)
                    ;
                    pdVar7[uVar20] = dVar38;
                  }
                  if (uVar24 < uVar20 + 1) {
                    dVar38 = dVar38 + *(double *)
                                       (*(long *)((long)ppdVar13 + lVar23 * 8 + lVar27) + uVar24 * 8
                                       ) * *(double *)
                                            (*(long *)((long)ppdVar6 + lVar23 * 8 + lVar27) +
                                            uVar26 * 8);
                    pdVar7[uVar20] = dVar38;
                  }
                  lVar23 = lVar23 + -1;
                }
                lVar27 = lVar27 + 8;
                uVar20 = uVar20 + 1;
              }
              dVar38 = 0.0;
              for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
                pdVar5 = (pHVar12->sm).g;
                dVar1 = (pHVar12->sm).wum[uVar20];
                dVar2 = pdVar5[uVar20];
                dVar41 = pHVar12->par[uVar20][uVar26] - mean;
                dVar40 = (dVar1 - dVar2) * local_68;
                if (pHVar12->gv_switch[uVar20] != '\0') {
                  dVar40 = dVar40 + ((dVar31 * -2.0 * (vari - dVar32)) / local_58) * dVar41;
                }
                dVar38 = dVar38 + (dVar2 * -0.5 + dVar1) * pHVar12->par[uVar20][uVar26] * local_68;
                dVar1 = pdVar4[uVar26];
                pdVar5[uVar20] =
                     (1.0 / (*(pHVar12->sm).wuw[uVar20] * local_78 +
                            ((dVar1 + dVar1) * dVar41 * dVar41 +
                            (vari - pdVar14[uVar26]) * dVar1 * local_a8) *
                            (-2.0 / ((auVar35._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)lVar28) - 4503599627370496.0))
                            ))) * dVar40;
              }
              uVar39 = 0x8000000000000000;
              dVar32 = -(dVar38 + (vari - (dVar32 + dVar32)) * vari * -0.5 * dVar31);
              dVar31 = local_88;
              if ((1 < uVar29) &&
                 (dVar31 = (double)(~-(ulong)(local_48 < dVar32) & (ulong)local_88 |
                                   (ulong)(local_88 * 0.5) & -(ulong)(local_48 < dVar32)),
                 dVar32 < local_48)) {
                dVar31 = dVar31 * 1.2;
              }
              for (uVar20 = 0; uVar19 != uVar20; uVar20 = uVar20 + 1) {
                if (pHVar12->gv_switch[uVar20] != '\0') {
                  pHVar12->par[uVar20][uVar26] =
                       (pHVar12->sm).g[uVar20] * dVar31 + pHVar12->par[uVar20][uVar26];
                }
              }
              uVar37 = uStack_80;
            }
          }
        }
      }
    }
    HVar9 = '\x01';
  }
  else {
    HVar9 = '\0';
    HTS_error(1,"HTS_PstreamSet_create: HTS_PStreamSet should be clear.\n");
  }
  return HVar9;
}

Assistant:

HTS_Boolean HTS_PStreamSet_create(HTS_PStreamSet * pss, HTS_SStreamSet * sss, double *msd_threshold, double *gv_weight)
{
   size_t i, j, k, l, m;
   int shift;
   size_t frame, msd_frame, state;

   HTS_PStream *pst;
   HTS_Boolean not_bound;

   if (pss->nstream != 0) {
      HTS_error(1, "HTS_PstreamSet_create: HTS_PStreamSet should be clear.\n");
      return FALSE;
   }

   /* initialize */
   pss->nstream = HTS_SStreamSet_get_nstream(sss);
   pss->pstream = (HTS_PStream *) HTS_calloc(pss->nstream, sizeof(HTS_PStream));
   pss->total_frame = HTS_SStreamSet_get_total_frame(sss);

   /* create */
   for (i = 0; i < pss->nstream; i++) {
      pst = &pss->pstream[i];
      if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {      /* for MSD */
         pst->length = 0;
         for (state = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
            if (HTS_SStreamSet_get_msd(sss, i, state) > msd_threshold[i])
               pst->length += HTS_SStreamSet_get_duration(sss, state);
         pst->msd_flag = (HTS_Boolean *) HTS_calloc(pss->total_frame, sizeof(HTS_Boolean));
         for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            if (HTS_SStreamSet_get_msd(sss, i, state) > msd_threshold[i]) {
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
                  pst->msd_flag[frame] = TRUE;
                  frame++;
               }
            } else {
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
                  pst->msd_flag[frame] = FALSE;
                  frame++;
               }
            }
         }
      } else {                  /* for non MSD */
         pst->length = pss->total_frame;
         pst->msd_flag = NULL;
      }
      pst->vector_length = HTS_SStreamSet_get_vector_length(sss, i);
      pst->width = HTS_SStreamSet_get_window_max_width(sss, i) * 2 + 1; /* band width of R */
      pst->win_size = HTS_SStreamSet_get_window_size(sss, i);
      if (pst->length > 0) {
         pst->sm.mean = HTS_alloc_matrix(pst->length, pst->vector_length * pst->win_size);
         pst->sm.ivar = HTS_alloc_matrix(pst->length, pst->vector_length * pst->win_size);
         pst->sm.wum = (double *) HTS_calloc(pst->length, sizeof(double));
         pst->sm.wuw = HTS_alloc_matrix(pst->length, pst->width);
         pst->sm.g = (double *) HTS_calloc(pst->length, sizeof(double));
         pst->par = HTS_alloc_matrix(pst->length, pst->vector_length);
      }
      /* copy dynamic window */
      pst->win_l_width = (int *) HTS_calloc(pst->win_size, sizeof(int));
      pst->win_r_width = (int *) HTS_calloc(pst->win_size, sizeof(int));
      pst->win_coefficient = (double **) HTS_calloc(pst->win_size, sizeof(double));
      for (j = 0; j < pst->win_size; j++) {
         pst->win_l_width[j] = HTS_SStreamSet_get_window_left_width(sss, i, j);
         pst->win_r_width[j] = HTS_SStreamSet_get_window_right_width(sss, i, j);
         if (pst->win_l_width[j] + pst->win_r_width[j] == 0)
            pst->win_coefficient[j] = (double *)
                HTS_calloc(-2 * pst->win_l_width[j] + 1, sizeof(double));
         else
            pst->win_coefficient[j] = (double *)
                HTS_calloc(-2 * pst->win_l_width[j], sizeof(double));
         pst->win_coefficient[j] -= pst->win_l_width[j];
         for (shift = pst->win_l_width[j]; shift <= pst->win_r_width[j]; shift++)
            pst->win_coefficient[j][shift] = HTS_SStreamSet_get_window_coefficient(sss, i, j, shift);
      }
      /* copy GV */
      if (HTS_SStreamSet_use_gv(sss, i)) {
         pst->gv_mean = (double *) HTS_calloc(pst->vector_length, sizeof(double));
         pst->gv_vari = (double *) HTS_calloc(pst->vector_length, sizeof(double));
         for (j = 0; j < pst->vector_length; j++) {
            pst->gv_mean[j] = HTS_SStreamSet_get_gv_mean(sss, i, j) * gv_weight[i];
            pst->gv_vari[j] = HTS_SStreamSet_get_gv_vari(sss, i, j);
         }
         pst->gv_switch = (HTS_Boolean *) HTS_calloc(pst->length, sizeof(HTS_Boolean));
         if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {   /* for MSD */
            for (state = 0, frame = 0, msd_frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++, frame++)
                  if (pst->msd_flag[frame] == TRUE)
                     pst->gv_switch[msd_frame++] = HTS_SStreamSet_get_gv_switch(sss, i, state);
         } else {               /* for non MSD */
            for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++)
               for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++)
                  pst->gv_switch[frame++] = HTS_SStreamSet_get_gv_switch(sss, i, state);
         }
         for (j = 0, pst->gv_length = 0; j < pst->length; j++)
            if (pst->gv_switch[j])
               pst->gv_length++;
      } else {
         pst->gv_switch = NULL;
         pst->gv_length = 0;
         pst->gv_mean = NULL;
         pst->gv_vari = NULL;
      }
      /* copy pdfs */
      if (HTS_SStreamSet_is_msd(sss, i) == TRUE) {      /* for MSD */
         for (state = 0, frame = 0, msd_frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
               if (pst->msd_flag[frame] == TRUE) {
                  /* check current frame is MSD boundary or not */
                  for (k = 0; k < pst->win_size; k++) {
                     not_bound = TRUE;
                     for (shift = pst->win_l_width[k]; shift <= pst->win_r_width[k]; shift++)
                        if ((int) frame + shift < 0 || (int) pss->total_frame <= (int) frame + shift || pst->msd_flag[frame + shift] != TRUE) {
                           not_bound = FALSE;
                           break;
                        }
                     for (l = 0; l < pst->vector_length; l++) {
                        m = pst->vector_length * k + l;
                        pst->sm.mean[msd_frame][m] = HTS_SStreamSet_get_mean(sss, i, state, m);
                        if (not_bound || k == 0)
                           pst->sm.ivar[msd_frame][m] = HTS_finv(HTS_SStreamSet_get_vari(sss, i, state, m));
                        else
                           pst->sm.ivar[msd_frame][m] = 0.0;
                     }
                  }
                  msd_frame++;
               }
               frame++;
            }
         }
      } else {                  /* for non MSD */
         for (state = 0, frame = 0; state < HTS_SStreamSet_get_total_state(sss); state++) {
            for (j = 0; j < HTS_SStreamSet_get_duration(sss, state); j++) {
               for (k = 0; k < pst->win_size; k++) {
                  not_bound = TRUE;
                  for (shift = pst->win_l_width[k]; shift <= pst->win_r_width[k]; shift++)
                     if ((int) frame + shift < 0 || (int) pss->total_frame <= (int) frame + shift) {
                        not_bound = FALSE;
                        break;
                     }
                  for (l = 0; l < pst->vector_length; l++) {
                     m = pst->vector_length * k + l;
                     pst->sm.mean[frame][m] = HTS_SStreamSet_get_mean(sss, i, state, m);
                     if (not_bound || k == 0)
                        pst->sm.ivar[frame][m] = HTS_finv(HTS_SStreamSet_get_vari(sss, i, state, m));
                     else
                        pst->sm.ivar[frame][m] = 0.0;
                  }
               }
               frame++;
            }
         }
      }
      /* parameter generation */
      HTS_PStream_mlpg(pst);
   }

   return TRUE;
}